

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person_builder.hpp
# Opt level: O1

void __thiscall PersonBuilder::PersonBuilder(PersonBuilder *this)

{
  Person local_c0;
  
  memset(&local_c0,0,0xa8);
  local_c0.street_address._M_dataplus._M_p = (pointer)&local_c0.street_address.field_2;
  local_c0.street_address._M_string_length = 0;
  local_c0.street_address.field_2._M_local_buf[0] = '\0';
  local_c0.post_code._M_dataplus._M_p = (pointer)&local_c0.post_code.field_2;
  local_c0.post_code._M_string_length = 0;
  local_c0.post_code.field_2._M_local_buf[0] = '\0';
  local_c0.city._M_dataplus._M_p = (pointer)&local_c0.city.field_2;
  local_c0.city._M_string_length = 0;
  local_c0.city.field_2._M_local_buf[0] = '\0';
  local_c0.company_name._M_dataplus._M_p = (pointer)&local_c0.company_name.field_2;
  local_c0.company_name._M_string_length = 0;
  local_c0.company_name.field_2._M_local_buf[0] = '\0';
  local_c0.position._M_dataplus._M_p = (pointer)&local_c0.position.field_2;
  local_c0.position._M_string_length = 0;
  local_c0.position.field_2._M_local_buf[0] = '\0';
  Person::Person((Person *)this,&local_c0);
  (this->person).super__Optional_base<Person,_false,_false>._M_payload.
  super__Optional_payload<Person,_true,_false,_false>.super__Optional_payload_base<Person>.
  _M_engaged = true;
  Person::~Person(&local_c0);
  this->person_reference = (Person *)this;
  return;
}

Assistant:

PersonBuilder()
		:	person{Person()},
			person_reference{*person}
	{}